

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>::
~MatcherBase(MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }